

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

void Curl_all_content_encodings(char *buf,size_t blen)

{
  Curl_cwtype *pCVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  Curl_cwtype **ppCVar6;
  
  *buf = '\0';
  uVar5 = 0;
  for (ppCVar6 = general_unencoders; pCVar1 = *ppCVar6, pCVar1 != (Curl_cwtype *)0x0;
      ppCVar6 = ppCVar6 + 1) {
    iVar2 = curl_strequal(pCVar1->name,"identity");
    if (iVar2 == 0) {
      sVar3 = strlen(pCVar1->name);
      uVar5 = uVar5 + sVar3 + 2;
    }
  }
  if (uVar5 == 0) {
    if (8 < blen) {
      builtin_strncpy(buf,"identity",9);
    }
  }
  else if (uVar5 < blen) {
    for (ppCVar6 = general_unencoders; pCVar1 = *ppCVar6, pCVar1 != (Curl_cwtype *)0x0;
        ppCVar6 = ppCVar6 + 1) {
      iVar2 = curl_strequal(pCVar1->name,"identity");
      if (iVar2 == 0) {
        strcpy(buf,pCVar1->name);
        sVar3 = strlen(buf);
        pcVar4 = buf + sVar3;
        buf = pcVar4 + 2;
        pcVar4[0] = ',';
        pcVar4[1] = ' ';
      }
    }
    buf[-2] = '\0';
  }
  return;
}

Assistant:

void Curl_all_content_encodings(char *buf, size_t blen)
{
  size_t len = 0;
  const struct Curl_cwtype * const *cep;
  const struct Curl_cwtype *ce;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  buf[0] = 0;

  for(cep = general_unencoders; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len) {
    if(blen >= sizeof(CONTENT_ENCODING_DEFAULT))
      strcpy(buf, CONTENT_ENCODING_DEFAULT);
  }
  else if(blen > len) {
    char *p = buf;
    for(cep = general_unencoders; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }
}